

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_sse2.c
# Opt level: O3

void HorizontalUnfilter_SSE2(uint8_t *prev,uint8_t *in,uint8_t *out,int width)

{
  uint8_t *puVar1;
  undefined8 uVar2;
  uint uVar3;
  ulong uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  char cVar14;
  char cVar15;
  
  if (prev == (uint8_t *)0x0) {
    uVar5 = '\0';
  }
  else {
    uVar5 = *prev;
  }
  uVar5 = uVar5 + *in;
  *out = uVar5;
  if (1 < width) {
    uVar3 = 1;
    if (8 < (uint)width) {
      uVar4 = 9;
      do {
        uVar2 = *(undefined8 *)(in + (uVar4 - 8));
        uVar11 = (char)uVar2 + uVar5;
        cVar7 = (char)((ulong)uVar2 >> 8);
        cVar8 = (char)((ulong)uVar2 >> 0x10);
        cVar9 = (char)((ulong)uVar2 >> 0x18);
        cVar10 = (char)((ulong)uVar2 >> 0x20);
        cVar14 = (char)((ulong)uVar2 >> 0x28);
        cVar15 = (char)((ulong)uVar2 >> 0x30);
        uVar6 = uVar11 + cVar7;
        cVar7 = cVar7 + cVar8;
        cVar8 = cVar8 + cVar9;
        cVar9 = cVar9 + cVar10;
        cVar10 = cVar10 + cVar14;
        uVar12 = uVar11 + cVar7;
        uVar13 = uVar6 + cVar8;
        uVar5 = uVar13 + cVar10 + cVar15 + (char)((ulong)uVar2 >> 0x38);
        puVar1 = out + (uVar4 - 8);
        *puVar1 = uVar11;
        puVar1[1] = uVar6;
        puVar1[2] = uVar12;
        puVar1[3] = uVar13;
        puVar1[4] = uVar11 + cVar7 + cVar9;
        puVar1[5] = uVar6 + cVar8 + cVar10;
        puVar1[6] = uVar12 + cVar9 + cVar14 + cVar15;
        puVar1[7] = uVar5;
        uVar4 = uVar4 + 8;
      } while (uVar4 <= (uint)width);
      uVar3 = (int)uVar4 - 8;
    }
    if ((int)uVar3 < width) {
      uVar4 = (ulong)uVar3;
      uVar5 = out[uVar4 - 1];
      do {
        uVar5 = uVar5 + in[uVar4];
        out[uVar4] = uVar5;
        uVar4 = uVar4 + 1;
      } while ((uint)width != uVar4);
    }
  }
  return;
}

Assistant:

static void HorizontalUnfilter_SSE2(const uint8_t* prev, const uint8_t* in,
                                    uint8_t* out, int width) {
  int i;
  __m128i last;
  out[0] = (uint8_t)(in[0] + (prev == NULL ? 0 : prev[0]));
  if (width <= 1) return;
  last = _mm_set_epi32(0, 0, 0, out[0]);
  for (i = 1; i + 8 <= width; i += 8) {
    const __m128i A0 = _mm_loadl_epi64((const __m128i*)(in + i));
    const __m128i A1 = _mm_add_epi8(A0, last);
    const __m128i A2 = _mm_slli_si128(A1, 1);
    const __m128i A3 = _mm_add_epi8(A1, A2);
    const __m128i A4 = _mm_slli_si128(A3, 2);
    const __m128i A5 = _mm_add_epi8(A3, A4);
    const __m128i A6 = _mm_slli_si128(A5, 4);
    const __m128i A7 = _mm_add_epi8(A5, A6);
    _mm_storel_epi64((__m128i*)(out + i), A7);
    last = _mm_srli_epi64(A7, 56);
  }
  for (; i < width; ++i) out[i] = (uint8_t)(in[i] + out[i - 1]);
}